

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MolecularRestraint.hpp
# Opt level: O3

void __thiscall OpenMD::MolecularRestraint::~MolecularRestraint(MolecularRestraint *this)

{
  pointer pVVar1;
  
  (this->super_Restraint)._vptr_Restraint = (_func_int **)&PTR__MolecularRestraint_00300c00;
  pVVar1 = (this->forces_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->forces_).
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  pVVar1 = (this->ref_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->ref_).
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  Restraint::~Restraint(&this->super_Restraint);
  operator_delete(this,0x100);
  return;
}

Assistant:

MolecularRestraint() : Restraint() {}